

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool anon_unknown.dwarf_79ada::getFileContents
               (string *filename,vector<char,_std::allocator<char>_> *buffer)

{
  undefined1 uVar1;
  char *pcVar2;
  vector<char,_std::allocator<char>_> *this;
  reference pvVar3;
  vector<char,_std::allocator<char>_> *in_RSI;
  streamsize size;
  ifstream file;
  value_type *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined1 local_248 [16];
  vector<char,_std::allocator<char>_> *local_238;
  long local_220 [65];
  vector<char,_std::allocator<char>_> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar2,_S_bin);
  uVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bool)uVar1) {
    std::istream::seekg((long)local_220,_S_beg);
    local_248 = std::istream::tellg();
    this = (vector<char,_std::allocator<char>_> *)
           std::fpos::operator_cast_to_long((fpos *)local_248);
    local_238 = this;
    if (0 < (long)this) {
      std::istream::seekg((long)local_220,_S_beg);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                 CONCAT17(uVar1,in_stack_fffffffffffffda8));
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](local_18,0);
      std::istream::read((char *)local_220,(long)pvVar3);
    }
    std::vector<char,_std::allocator<char>_>::push_back(this,in_stack_fffffffffffffd88);
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool getFileContents(const std::string& filename, std::vector<char>& buffer)
    {
        std::ifstream file(filename.c_str(), std::ios_base::binary);
        if (file)
        {
            file.seekg(0, std::ios_base::end);
            std::streamsize size = file.tellg();
            if (size > 0)
            {
                file.seekg(0, std::ios_base::beg);
                buffer.resize(static_cast<std::size_t>(size));
                file.read(&buffer[0], size);
            }
            buffer.push_back('\0');
            return true;
        }
        else
        {
            return false;
        }
    }